

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RP5C01.cpp
# Opt level: O1

ssize_t __thiscall Ricoh::RP5C01::RP5C01::read(RP5C01 *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  uVar7 = __fd & 0xf;
  if ((uVar7 < 0xd) && (1 < this->mode_)) {
    lVar3 = 0xd;
    if (this->mode_ != 3) {
      lVar3 = 0;
    }
    uVar4 = (ulong)(this->ram_)._M_elems[(ulong)uVar7 + lVar3];
    goto switchD_001b544a_caseD_e;
  }
  uVar6 = this->mode_ << 4 | uVar7;
  uVar4 = 0xf;
  switch(uVar6) {
  case 0:
    uVar4 = (ulong)this->seconds_;
    break;
  case 1:
    iVar5 = this->seconds_;
    iVar1 = (int)((ulong)((long)iVar5 * 0x66666667) >> 0x20);
    iVar2 = iVar5 / 10 + (iVar5 >> 0x1f);
    goto LAB_001b555d;
  case 2:
    uVar4 = (ulong)(this->seconds_ / 0x3c);
    break;
  case 3:
    iVar5 = this->seconds_;
    iVar1 = (int)((ulong)((long)iVar5 * 0x1b4e81b5) >> 0x20);
    iVar2 = iVar5 / 600 + (iVar5 >> 0x1f);
LAB_001b555d:
    iVar2 = iVar2 - (iVar1 >> 0x1f);
    iVar5 = (iVar2 / 6) * 6;
    goto LAB_001b55d3;
  case 4:
  case 5:
    iVar5 = this->seconds_ / 0xe10;
    uVar6 = iVar5 + (((uint)(iVar5 / 6 + (iVar5 >> 0x1f)) >> 2) - (iVar5 >> 0x1f)) * -0x18;
    uVar4 = (ulong)uVar6;
    if (this->twentyfour_hour_clock_ == false) {
      if (uVar6 == 0) {
        uVar4 = 0xc;
      }
      else if (uVar6 == 0xc) {
        uVar4 = 0x1c;
      }
      else {
        uVar4 = (ulong)((uint)(0xc < (int)uVar6) * 0x10 +
                       uVar6 + (((uint)((int)uVar6 / 6 + ((int)uVar6 >> 0x1f)) >> 1) -
                               ((int)uVar6 >> 0x1f)) * -0xc);
      }
    }
    iVar5 = (int)uVar4 / 10;
    if (uVar7 != 4) {
      uVar4 = (ulong)(uint)(iVar5 % 10);
      goto switchD_001b544a_caseD_e;
    }
    goto LAB_001b55ce;
  case 6:
    uVar4 = (ulong)(uint)this->day_of_the_week_;
    goto switchD_001b544a_caseD_e;
  case 7:
    uVar4 = (ulong)this->day_;
    break;
  case 8:
    lVar3 = (long)this->day_;
    goto LAB_001b55a4;
  case 9:
    uVar4 = (ulong)(this->month_ + 1);
    break;
  case 10:
    lVar3 = (long)(this->month_ + 1);
    goto LAB_001b55a4;
  case 0xb:
    uVar4 = (ulong)this->year_;
    break;
  case 0xc:
    lVar3 = (long)this->year_;
LAB_001b55a4:
    iVar5 = (int)((ulong)(lVar3 * 0x66666667) >> 0x20);
    uVar4 = (ulong)((iVar5 >> 2) - (iVar5 >> 0x1f));
    break;
  case 0xd:
  case 0x1d:
  case 0x2d:
    goto switchD_001b544a_caseD_d;
  case 0xe:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1c:
  case 0x1e:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2e:
    goto switchD_001b544a_caseD_e;
  case 0xf:
  case 0x1f:
  case 0x2f:
switchD_001b544a_caseD_f:
    uVar4 = (ulong)((this->one_hz_on_ ^ 1) * 8 + (this->sixteen_hz_on_ ^ 1) * 4);
    goto switchD_001b544a_caseD_e;
  case 0x1a:
    uVar4 = (ulong)this->twentyfour_hour_clock_;
    goto switchD_001b544a_caseD_e;
  case 0x1b:
    uVar4 = (ulong)(uint)this->leap_year_;
    goto switchD_001b544a_caseD_e;
  default:
    if (uVar6 != 0x3d) {
      if (uVar6 != 0x3f) goto switchD_001b544a_caseD_e;
      goto switchD_001b544a_caseD_f;
    }
    goto switchD_001b544a_caseD_d;
  }
  iVar5 = (int)(uVar4 * 0x66666667 >> 0x20);
  iVar5 = (iVar5 >> 2) - (iVar5 >> 0x1f);
LAB_001b55ce:
  iVar2 = (int)uVar4;
  iVar5 = iVar5 * 10;
LAB_001b55d3:
  uVar4 = (ulong)(uint)(iVar2 - iVar5);
switchD_001b544a_caseD_e:
  return uVar4 | 0xf0;
switchD_001b544a_caseD_d:
  uVar4 = (ulong)((uint)this->alarm_enabled_ * 4 + (uint)this->timer_enabled_ * 8 | this->mode_);
  goto switchD_001b544a_caseD_e;
}

Assistant:

uint8_t RP5C01::read(int address) {
	address &= 0xf;

	if(address < 0xd && mode_ >= 2) {
		address += mode_ == 3 ? 13 : 0;
		return 0xf0 | ram_[size_t(address)];
	}

	int value = 0xf;
	switch(Reg(mode_, address)) {
		// Second.
		case Reg(0, 0x00):	value = SecondEncoder::decode<0>(seconds_);	break;
		case Reg(0, 0x01):	value = SecondEncoder::decode<1>(seconds_);	break;

		// Minute.
		case Reg(0, 0x02):	value = SecondEncoder::decode<2>(seconds_);	break;
		case Reg(0, 0x03):	value = SecondEncoder::decode<3>(seconds_);	break;

		// Hour.
		case Reg(0, 0x04):
		case Reg(0, 0x05): {
			int hours = SecondEncoder::decode<4>(seconds_);
			if(!twentyfour_hour_clock_) {
				hours = twenty_four_to_twelve(hours);
			}
			if(address == 0x4) {
				value = TwoDigitEncoder::decode<0>(hours);
			} else {
				value = TwoDigitEncoder::decode<1>(hours);
			}
		} break;

		// Day-of-the-week.
		case Reg(0, 0x06):	value = day_of_the_week_;	break;

		// Day.
		case Reg(0, 0x07):	value = TwoDigitEncoder::decode<0>(day_);		break;
		case Reg(0, 0x08):	value = TwoDigitEncoder::decode<1>(day_);		break;

		// Month.
		case Reg(0, 0x09):	value = TwoDigitEncoder::decode<0>(month_ + 1);	break;
		case Reg(0, 0x0a):	value = TwoDigitEncoder::decode<1>(month_ + 1);	break;

		// Year.
		case Reg(0, 0x0b):	value = TwoDigitEncoder::decode<0>(year_);		break;
		case Reg(0, 0x0c):	value = TwoDigitEncoder::decode<1>(year_);		break;

		// TODO: alarm minutes.
		case Reg(1, 0x02):
		case Reg(1, 0x03):	break;

		// TODO: alarm hours.
		case Reg(1, 0x04):
		case Reg(1, 0x05):	break;

		// TODO: alarm day-of-the-week.
		case Reg(1, 0x06):	break;

		// TODO: alarm day.
		case Reg(1, 0x07):
		case Reg(1, 0x08):	break;

		// 12/24-hour clock.
		case Reg(1, 0x0a):	value = twentyfour_hour_clock_;	break;

		// Leap year.
		case Reg(1, 0x0b):	value = leap_year_;				break;

		//
		// Registers D–F don't depend on the mode.
		//

		case Reg(0, 0xd):	case Reg(1, 0xd):	case Reg(2, 0xd):	case Reg(3, 0xd):
			value =
				(timer_enabled_ ? 0x8 : 0x0) |
				(alarm_enabled_ ? 0x4 : 0x0) |
				mode_;
		break;
		case Reg(0, 0xe):	case Reg(1, 0xe):	case Reg(2, 0xe):	case Reg(3, 0xe):
			// Test register; unclear what is supposed to happen.
		break;
		case Reg(0, 0xf):	case Reg(1, 0xf):	case Reg(2, 0xf):	case Reg(3, 0xf):
			value =
				(one_hz_on_ ? 0x0 : 0x8) |
				(sixteen_hz_on_ ? 0x0 : 0x4);
		break;
	}

	return uint8_t(0xf0 | value);
}